

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  unsigned_short uVar2;
  CallInfo *pCVar3;
  CallInfo *pCVar4;
  ptrdiff_t pVar5;
  int errcode;
  StkId level;
  StkId oldtop;
  ptrdiff_t old_errfunc;
  lu_byte old_allowhooks;
  ptrdiff_t old_ci;
  unsigned_short oldnCcalls;
  int status;
  ptrdiff_t ef_local;
  ptrdiff_t old_top_local;
  void *u_local;
  Pfunc func_local;
  lua_State *L_local;
  
  uVar2 = L->nCcalls;
  pCVar3 = L->ci;
  pCVar4 = L->base_ci;
  lVar1 = L->allowhook;
  pVar5 = L->errfunc;
  L->errfunc = ef;
  errcode = luaD_rawrunprotected(L,func,u);
  if (errcode != 0) {
    level = (StkId)((long)&L->stack->value + old_top);
    luaF_close(L,level);
    luaD_seterrorobj(L,errcode,level);
    L->nCcalls = uVar2;
    L->ci = (CallInfo *)((long)L->base_ci + ((long)pCVar3 - (long)pCVar4));
    L->base = L->ci->base;
    L->savedpc = L->ci->savedpc;
    L->allowhook = lVar1;
    restore_stack_limit(L);
  }
  L->errfunc = pVar5;
  return errcode;
}

Assistant:

static int luaD_pcall(lua_State*L,Pfunc func,void*u,
ptrdiff_t old_top,ptrdiff_t ef){
int status;
unsigned short oldnCcalls=L->nCcalls;
ptrdiff_t old_ci=saveci(L,L->ci);
lu_byte old_allowhooks=L->allowhook;
ptrdiff_t old_errfunc=L->errfunc;
L->errfunc=ef;
status=luaD_rawrunprotected(L,func,u);
if(status!=0){
StkId oldtop=restorestack(L,old_top);
luaF_close(L,oldtop);
luaD_seterrorobj(L,status,oldtop);
L->nCcalls=oldnCcalls;
L->ci=restoreci(L,old_ci);
L->base=L->ci->base;
L->savedpc=L->ci->savedpc;
L->allowhook=old_allowhooks;
restore_stack_limit(L);
}
L->errfunc=old_errfunc;
return status;
}